

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ConstructMapExpression
          (duckdb *this,ClientContext *context,idx_t param_2,ColumnMapResult *mapping,
          MultiFileColumnDefinition *global_column,bool is_trivially_mappable)

{
  LogicalType *other;
  BaseExpression *pBVar1;
  undefined1 auVar2 [8];
  _func_int **pp_Var3;
  bool bVar4;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var5;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> _Var6;
  tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_> this_00;
  reference pvVar7;
  reference target_type;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var8;
  pointer *__ptr;
  LogicalType *other_00;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  ScalarFunction remap_fun;
  undefined1 local_218 [8];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_210;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_208;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_200;
  undefined1 local_1f8 [16];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_1e8;
  undefined1 local_1c8 [88];
  LogicalType local_170;
  ScalarFunction local_158;
  
  local_200._M_head_impl = (Expression *)this;
  local_1f8._0_8_ = context;
  optional_ptr<const_duckdb::MultiFileColumnDefinition,_true>::CheckValid(&mapping->local_column);
  local_210._M_head_impl = (Expression *)0x0;
  other_00 = &((mapping->local_column).ptr)->type;
  _Var5._M_head_impl = (Expression *)operator_new(0x60);
  LogicalType::LogicalType((LogicalType *)&local_158,other_00);
  BoundReferenceExpression::BoundReferenceExpression
            ((BoundReferenceExpression *)_Var5._M_head_impl,(LogicalType *)&local_158,param_2);
  LogicalType::~LogicalType((LogicalType *)&local_158);
  if (local_210._M_head_impl != (Expression *)0x0) {
    pBVar1 = &(local_210._M_head_impl)->super_BaseExpression;
    local_210._M_head_impl = _Var5._M_head_impl;
    (*pBVar1->_vptr_BaseExpression[1])();
    _Var5._M_head_impl = local_210._M_head_impl;
  }
  local_210._M_head_impl = _Var5._M_head_impl;
  other = &global_column->type;
  if ((global_column->type).id_ == STRUCT) {
    if ((mapping->column_map).is_null == false) {
      if ((mapping->column_map).type_.id_ != STRUCT || is_trivially_mappable) goto LAB_0123abf6;
      local_1e8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1e8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1e8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_1e8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_210);
      LogicalType::LogicalType(&local_170,other);
      Value::Value((Value *)local_1c8,&local_170);
      _Var6.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::Expression_*,_false>)operator_new(0x98);
      Value::Value((Value *)&local_158,(Value *)local_1c8);
      BoundConstantExpression::BoundConstantExpression
                ((BoundConstantExpression *)
                 _Var6.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,
                 (Value *)&local_158);
      Value::~Value((Value *)&local_158);
      local_218 = (undefined1  [8])
                  _Var6.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_1e8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_218);
      if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)local_218 !=
          (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
        (*(((Expression *)local_218)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_218 = (undefined1  [8])0x0;
      Value::~Value((Value *)local_1c8);
      LogicalType::~LogicalType(&local_170);
      this_00.
      super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
      .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
           )operator_new(0x98);
      Value::Value((Value *)&local_158,&mapping->column_map);
      BoundConstantExpression::BoundConstantExpression
                ((BoundConstantExpression *)
                 this_00.
                 super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                 .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl,
                 (Value *)&local_158);
      Value::~Value((Value *)&local_158);
      local_1c8._0_8_ =
           this_00.
           super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
           .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_1e8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_1c8);
      if ((_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
          local_1c8._0_8_ != (BaseStatistics *)0x0) {
        (**(code **)(*(long *)local_1c8._0_8_ + 8))();
      }
      if ((mapping->default_value).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == (Expression *)0x0) {
        LogicalType::LogicalType((LogicalType *)(local_1c8 + 0x40),SQLNULL);
        Value::Value((Value *)local_1c8,(LogicalType *)(local_1c8 + 0x40));
        _Var6.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (_Head_base<0UL,_duckdb::Expression_*,_false>)operator_new(0x98);
        Value::Value((Value *)&local_158,(Value *)local_1c8);
        BoundConstantExpression::BoundConstantExpression
                  ((BoundConstantExpression *)
                   _Var6.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,
                   (Value *)&local_158);
        Value::~Value((Value *)&local_158);
        local_218 = (undefined1  [8])
                    _Var6.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_1e8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_218);
        if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)local_218 !=
            (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
          (*(((Expression *)local_218)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_218 = (undefined1  [8])0x0;
        Value::~Value((Value *)local_1c8);
        LogicalType::~LogicalType((LogicalType *)(local_1c8 + 0x40));
      }
      else {
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_1e8,&mapping->default_value);
      }
      RemapStructFun::GetFunction();
      (*local_158.bind)((ClientContext *)local_1c8,(ScalarFunction *)local_1f8._0_8_,
                        (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                         *)&local_158);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)&local_1e8,0);
      _Var8._M_head_impl = local_200._M_head_impl;
      local_208._M_head_impl =
           (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      target_type = vector<duckdb::LogicalType,_true>::operator[]
                              (&local_158.super_BaseScalarFunction.super_SimpleFunction.arguments,0)
      ;
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)local_218,(ClientContext *)local_1f8._0_8_,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_208,target_type,false);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)&local_1e8,0);
      auVar2 = local_218;
      local_218 = (undefined1  [8])0x0;
      _Var5._M_head_impl =
           (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)auVar2;
      if (_Var5._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseExpression + 8))();
      }
      if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          local_218 != (Expression *)0x0) {
        (**(code **)(*(long *)local_218 + 8))();
      }
      local_218 = (undefined1  [8])0x0;
      if (local_208._M_head_impl != (Expression *)0x0) {
        (*((local_208._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_208._M_head_impl = (Expression *)0x0;
      make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType_const&,duckdb::ScalarFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>>
                ((duckdb *)local_218,other,&local_158,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)&local_1e8,
                 (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)local_1c8);
      *(undefined1 (*) [8])_Var8._M_head_impl = local_218;
      if ((BoundConstantExpression *)local_1c8._0_8_ != (BoundConstantExpression *)0x0) {
        (*(((Expression *)local_1c8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__ScalarFunction_0243add0;
      if (local_158.function_info.internal.
          super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_158.function_info.internal.
                   super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_158.function.super__Function_base._M_manager)
                  ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,
                   __destroy_functor);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector(&local_1e8);
    }
    else {
      if (is_trivially_mappable) goto LAB_0123abf6;
      ((local_200._M_head_impl)->super_BaseExpression)._vptr_BaseExpression =
           (_func_int **)
           (mapping->default_value).
           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (mapping->default_value).
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      _Var8._M_head_impl = local_200._M_head_impl;
    }
    if ((BoundReferenceExpression *)local_210._M_head_impl != (BoundReferenceExpression *)0x0) {
      (*(((Expression *)&(local_210._M_head_impl)->super_BaseExpression)->super_BaseExpression).
        _vptr_BaseExpression[1])();
    }
  }
  else {
LAB_0123abf6:
    bVar4 = LogicalType::operator==(other_00,other);
    _Var8._M_head_impl = local_200._M_head_impl;
    if (!bVar4) {
      local_1f8._8_8_ = local_210._M_head_impl;
      local_210._M_head_impl = (Expression *)0x0;
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)&local_158,(ClientContext *)local_1f8._0_8_,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 (local_1f8 + 8),other,false);
      pp_Var3 = local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                _vptr_Function;
      _Var8._M_head_impl = local_200._M_head_impl;
      _Var5._M_head_impl = local_210._M_head_impl;
      local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)0x0;
      local_210._M_head_impl = (Expression *)pp_Var3;
      if ((_Var5._M_head_impl != (Expression *)0x0) &&
         ((*((_Var5._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])(),
         local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
         (_func_int **)0x0)) {
        (**(code **)(*local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                      _vptr_Function + 8))();
      }
      local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)0x0;
      if ((BoundReferenceExpression *)local_1f8._8_8_ != (BoundReferenceExpression *)0x0) {
        (**(code **)(*(long *)local_1f8._8_8_ + 8))();
      }
    }
    ((_Var8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression =
         (_func_int **)local_210._M_head_impl;
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         _Var8._M_head_impl;
}

Assistant:

unique_ptr<Expression> ConstructMapExpression(ClientContext &context, idx_t local_idx, ColumnMapResult &mapping,
                                              const MultiFileColumnDefinition &global_column,
                                              bool is_trivially_mappable) {
	auto &local_column = *mapping.local_column;
	unique_ptr<Expression> expr;
	expr = make_uniq<BoundReferenceExpression>(local_column.type, local_idx);
	if (global_column.type.id() != LogicalTypeId::STRUCT ||
	    (!mapping.column_map.IsNull() && mapping.column_map.type().id() != LogicalTypeId::STRUCT) ||
	    is_trivially_mappable) {
		// not a struct - potentially add a cast
		if (local_column.type != global_column.type) {
			expr = BoundCastExpression::AddCastToType(context, std::move(expr), global_column.type);
		}
		return expr;
	}
	// struct column - generate a remap_struct - but only if we have any columns to remap
	if (mapping.column_map.IsNull()) {
		// no columns to map - emit the default value directly
		return std::move(mapping.default_value);
	}
	// generate the remap_struct function call
	vector<unique_ptr<Expression>> children;
	children.push_back(std::move(expr));
	children.push_back(make_uniq<BoundConstantExpression>(Value(global_column.type)));
	children.push_back(make_uniq<BoundConstantExpression>(std::move(mapping.column_map)));
	if (!mapping.default_value) {
		children.push_back(make_uniq<BoundConstantExpression>(Value()));
	} else {
		children.push_back(std::move(mapping.default_value));
	}
	auto remap_fun = RemapStructFun::GetFunction();
	auto bind_data = remap_fun.bind(context, remap_fun, children);
	children[0] = BoundCastExpression::AddCastToType(context, std::move(children[0]), remap_fun.arguments[0]);
	return make_uniq<BoundFunctionExpression>(global_column.type, std::move(remap_fun), std::move(children),
	                                          std::move(bind_data));
}